

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O2

void __thiscall
TaprootUtil_CreateTapScriptControl_Elements_Sign_Test::TestBody
          (TaprootUtil_CreateTapScriptControl_Elements_Sign_Test *this)

{
  ScriptBuilder *pSVar1;
  char *pcVar2;
  char *in_R9;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *utxo_list_00;
  bool is_parity;
  AssertionResult gtest_ar_14;
  AssertHelper local_c38;
  SchnorrSignature schnorr_sig;
  AssertionResult gtest_ar_15;
  ConfidentialTransaction tx1;
  AssertHelper local_ba8;
  ConfidentialAssetId asset;
  TapScriptData script_data;
  SchnorrSignature sig2;
  ByteData256 sighash2;
  SchnorrPubkey schnorr_pubkey;
  BlockHash genesis_block_hash;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> utxo_list;
  SchnorrPubkey pk0;
  SigHashType sighash_type;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  ByteData taproot_control;
  Pubkey pubkey;
  SigHashType local_97c;
  Address addr;
  Privkey key;
  Address addr01;
  DescriptorScriptReference ref;
  Script locking_script;
  Script redeem_script;
  TaprootScriptTree tree;
  Descriptor desc;
  ScriptWitness local_70;
  ScriptWitness local_50;
  ScriptWitness local_30;
  
  std::__cxx11::string::string
            ((string *)&ref,"cQRxS6BoPsuT8nyHMCYAKsRVDSnLisMxw4gUTeMURKioMMxTMSPE",
             (allocator *)&addr01);
  cfd::core::Privkey::FromWif(&key,(string *)&ref,kCustomChain,true);
  std::__cxx11::string::~string((string *)&ref);
  cfd::core::Privkey::GeneratePubkey(&pubkey,&key,true);
  is_parity = false;
  cfd::core::SchnorrPubkey::FromPubkey(&schnorr_pubkey,&pubkey,&is_parity);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&ref,&schnorr_pubkey);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&addr01,
             "\"91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e\"",
             "schnorr_pubkey.GetHex()",
             (char (*) [65])"91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  if ((undefined1)addr01.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&ref);
    if (addr01._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr01._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xe2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr01.witness_ver_);
  addr01.type_._0_1_ = is_parity;
  addr01.witness_ver_ = kVersion0;
  addr01._12_4_ = 0;
  if (is_parity == false) {
    testing::Message::Message((Message *)&addr);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ref,(internal *)&addr01,(AssertionResult *)"is_parity","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&desc,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xe3,(char *)ref._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&desc,(Message *)&addr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&desc);
    std::__cxx11::string::~string((string *)&ref);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr01.witness_ver_);
  ref._0_8_ = &PTR__ScriptBuilder_006f8aa0;
  ref.locking_script_._vptr_Script = (_func_int **)0x0;
  ref.locking_script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ref.locking_script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cfd::core::SchnorrPubkey::GetData((ByteData *)&addr01,&schnorr_pubkey);
  pSVar1 = cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&ref,(ByteData *)&addr01);
  pSVar1 = cfd::core::ScriptBuilder::operator<<
                     (pSVar1,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&redeem_script,pSVar1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr01);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&ref);
  nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&redeem_script,kElementsRegtest);
  cfd::core::TapBranch::ToString_abi_cxx11_((string *)&ref,&tree.super_TapBranch);
  testing::internal::CmpHelperEQ<char[73],std::__cxx11::string>
            ((internal *)&addr01,
             "\"tl(2091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac)\"",
             "tree.ToString()",
             (char (*) [73])
             "tl(2091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  if ((undefined1)addr01.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&ref);
    if (addr01._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr01._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr01.witness_ver_);
  cfd::core::TaprootScriptTree::GetTapLeafHash((ByteData256 *)&addr01,&tree);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&ref,(ByteData256 *)&addr01);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&addr,
             "\"28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0\"",
             "tree.GetTapLeafHash().GetHex()",
             (char (*) [65])"28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr01);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&ref);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr01,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr01,(Message *)&ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr01);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&addr01,&tree.super_TapBranch);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&ref,(ByteData256 *)&addr01);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&addr,
             "\"28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0\"",
             "tree.GetCurrentBranchHash().GetHex()",
             (char (*) [65])"28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr01);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&ref);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr01,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xec,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr01,(Message *)&ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr01);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  cfd::core::TapBranch::GetTweakedPubkey
            ((SchnorrPubkey *)&addr01,&tree.super_TapBranch,&schnorr_pubkey,(bool *)0x0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&ref,(SchnorrPubkey *)&addr01);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&addr,
             "\"bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495\"",
             "tree.GetTweakedPubkey(schnorr_pubkey).GetHex()",(char (*) [65])0x4905ae,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr01);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&ref);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr01,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xed,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr01,(Message *)&ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr01);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  cfd::core::Script::Script(&locking_script);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&pk0);
  cfd::core::TaprootUtil::CreateTapScriptControl
            (&taproot_control,&schnorr_pubkey,&tree.super_TapBranch,&pk0,&locking_script);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&ref,&pk0);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&addr01,
             "\"bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495\"","pk0.GetHex()",
             (char (*) [65])0x4905ae,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  if ((undefined1)addr01.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&ref);
    if (addr01._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr01._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xf2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr01.witness_ver_);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            (&addr01,kCfdInvalidSettingError,kVersion1,&pk0,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &ref);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &ref);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&ref,&addr01);
  testing::internal::CmpHelperEQ<char[64],std::__cxx11::string>
            ((internal *)&addr,"\"ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz\""
             ,"addr01.GetAddress()",
             (char (*) [64])"ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&ref);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&desc,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&desc,(Message *)&ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&desc);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&addr,&locking_script);
  cfd::core::Address::GetLockingScript((Script *)&ref,&addr01);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&desc,(Script *)&ref);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&sig2,"locking_script.GetHex()","addr01.GetLockingScript().GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&desc);
  std::__cxx11::string::~string((string *)&desc);
  cfd::core::Script::~Script((Script *)&ref);
  std::__cxx11::string::~string((string *)&addr);
  if ((char)sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&ref);
    if (sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)sig2.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xf5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  cfd::core::Address::GetLockingScript((Script *)&ref,&addr01);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&addr,(Script *)&ref);
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&desc,
             "\"5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495\"",
             "addr01.GetLockingScript().GetHex()",
             (char (*) [69])"5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  cfd::core::Script::~Script((Script *)&ref);
  if ((char)desc.root_node_.name_._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&ref);
    if (desc.root_node_.name_._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)desc.root_node_.name_._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&desc.root_node_.name_._M_string_length);
  addr.type_._0_1_ = cfd::core::TapBranch::HasTapLeaf(&tree.super_TapBranch);
  addr.witness_ver_ = kVersion0;
  addr._12_4_ = 0;
  if (!(bool)(undefined1)addr.type_) {
    testing::Message::Message((Message *)&desc);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ref,(internal *)&addr,(AssertionResult *)"tree.HasTapLeaf()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xf7,(char *)ref._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sig2,(Message *)&desc);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig2);
    std::__cxx11::string::~string((string *)&ref);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&desc);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  addr.type_._0_1_ = cfd::core::TapBranch::IsElements(&tree.super_TapBranch);
  addr.witness_ver_ = kVersion0;
  addr._12_4_ = 0;
  if (!(bool)(undefined1)addr.type_) {
    testing::Message::Message((Message *)&desc);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ref,(internal *)&addr,(AssertionResult *)"tree.IsElements()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xf8,(char *)ref._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sig2,(Message *)&desc);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig2);
    std::__cxx11::string::~string((string *)&ref);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&desc);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  std::__cxx11::string::string
            ((string *)&ref,
             "tr(91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e,pk(91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e))"
             ,(allocator *)&addr);
  cfd::core::Descriptor::ParseElements(&desc,(string *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  cfd::core::Descriptor::GetReference
            (&ref,&desc,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0);
  cfd::core::DescriptorScriptReference::GenerateAddress(&addr,&ref,kElementsRegtest);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&sig2,&addr);
  testing::internal::CmpHelperEQ<char[64],std::__cxx11::string>
            ((internal *)&tx1,"\"ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz\"",
             "addr.GetAddress()",
             (char (*) [64])"ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig2);
  std::__cxx11::string::~string((string *)&sig2);
  if ((char)tx1.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&sig2);
    if (tx1.super_AbstractTransaction.wally_tx_pointer_ == (void *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *tx1.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&schnorr_sig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xfd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&schnorr_sig,(Message *)&sig2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&schnorr_sig);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tx1.super_AbstractTransaction.wally_tx_pointer_);
  cfd::core::DescriptorScriptReference::GetLockingScript((Script *)&sig2,&ref);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&tx1,(Script *)&sig2);
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&schnorr_sig,
             "\"5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495\"",
             "ref.GetLockingScript().GetHex()",
             (char (*) [69])"5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx1);
  std::__cxx11::string::~string((string *)&tx1);
  cfd::core::Script::~Script((Script *)&sig2);
  if ((char)schnorr_sig.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&sig2);
    if (schnorr_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)schnorr_sig.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xfe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx1,(Message *)&sig2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&schnorr_sig.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  cfd::core::DescriptorScriptReference::GetKeyList
            ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              *)&schnorr_sig,&ref);
  cfd::core::DescriptorKeyReference::GetSchnorrPubkey
            ((SchnorrPubkey *)&tx1,
             (DescriptorKeyReference *)
             CONCAT71(schnorr_sig.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start._1_7_,
                      (char)schnorr_sig.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start));
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&sig2,(SchnorrPubkey *)&tx1);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&asset,
             "\"91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e\"",
             "ref.GetKeyList()[0].GetSchnorrPubkey().GetHex()",
             (char (*) [65])"91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig2);
  std::__cxx11::string::~string((string *)&sig2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx1);
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)&schnorr_sig);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&sig2);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xff,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx1,(Message *)&sig2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  cfd::core::TapBranch::ToString_abi_cxx11_((string *)&tx1,&tree.super_TapBranch);
  cfd::core::DescriptorScriptReference::GetScriptTree((TaprootScriptTree *)&sig2,&ref);
  cfd::core::TapBranch::ToString_abi_cxx11_((string *)&schnorr_sig,(TapBranch *)&sig2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&asset,"tree.ToString()","ref.GetScriptTree().ToString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&schnorr_sig);
  std::__cxx11::string::~string((string *)&schnorr_sig);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&sig2);
  std::__cxx11::string::~string((string *)&tx1);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&sig2);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx1,(Message *)&sig2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  cfd::core::DescriptorScriptReference::GetScriptTree((TaprootScriptTree *)&sig2,&ref);
  tx1.super_AbstractTransaction._vptr_AbstractTransaction._0_1_ =
       cfd::core::TapBranch::IsElements((TapBranch *)&sig2);
  tx1.super_AbstractTransaction.wally_tx_pointer_ = (void *)0x0;
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&sig2);
  if ((char)tx1.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&schnorr_sig);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sig2,(internal *)&tx1,
               (AssertionResult *)"ref.GetScriptTree().IsElements()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&asset,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x101,(char *)CONCAT71(sig2.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       (char)sig2.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start));
    testing::internal::AssertHelper::operator=((AssertHelper *)&asset,(Message *)&schnorr_sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset);
    std::__cxx11::string::~string((string *)&sig2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&schnorr_sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tx1.super_AbstractTransaction.wally_tx_pointer_);
  std::__cxx11::string::string
            ((string *)&sig2,
             "020000000102f746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290100000000fffffffff746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000017d77c300016001423dc2db292ef54e171839e4a4391d8b45aefcd4b0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007d000000000000000000140396f2b94c6a81151d07faa26d5f5d7c751b62b1aea59ad7ed9d17fea60ef17e8e2eab28b55796ec0d01b0565c4658b279381674dcce633ee1851125ac762c494000000000000000000"
             ,(allocator *)&schnorr_sig);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx1,(string *)&sig2);
  std::__cxx11::string::~string((string *)&sig2);
  std::__cxx11::string::string
            ((string *)&sig2,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)&schnorr_sig);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset,(string *)&sig2);
  std::__cxx11::string::~string((string *)&sig2);
  std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::vector
            (&utxo_list,2,(allocator_type *)&sig2);
  std::__cxx11::string::string
            ((string *)&script_data,
             "512016f8551db6483d403e9bf3c0b74a5bbafaa20cf0e45ca7e4a35cae924f7a0514",
             (allocator *)&sighash2);
  cfd::core::Script::Script((Script *)&schnorr_sig,(string *)&script_data);
  cfd::core::Amount::Amount((Amount *)&gtest_ar_14,200000000);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&genesis_block_hash,(Amount *)&gtest_ar_14);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)&sig2,(Script *)&schnorr_sig,&asset,
             (ConfidentialValue *)&genesis_block_hash);
  cfd::core::ConfidentialTxOut::operator=
            (utxo_list.
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_start,(ConfidentialTxOut *)&sig2);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&sig2);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&genesis_block_hash);
  cfd::core::Script::~Script((Script *)&schnorr_sig);
  std::__cxx11::string::~string((string *)&script_data);
  std::__cxx11::string::string
            ((string *)&script_data,
             "5120e247cebb9d05e3ce87133b3c6cfd15eed31b43f61fe3ceede12594e55966035b",
             (allocator *)&sighash2);
  cfd::core::Script::Script((Script *)&schnorr_sig,(string *)&script_data);
  cfd::core::Amount::Amount((Amount *)&gtest_ar_14,200000000);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&genesis_block_hash,(Amount *)&gtest_ar_14);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)&sig2,(Script *)&schnorr_sig,&asset,
             (ConfidentialValue *)&genesis_block_hash);
  cfd::core::ConfidentialTxOut::operator=
            (utxo_list.
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,(ConfidentialTxOut *)&sig2);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&sig2);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&genesis_block_hash);
  cfd::core::Script::~Script((Script *)&schnorr_sig);
  std::__cxx11::string::~string((string *)&script_data);
  std::__cxx11::string::string
            ((string *)&sig2,"cc2641af46f536fba45aab6016f63e12a80e4c98bbb2686dafb22b9451cfe338",
             (allocator *)&schnorr_sig);
  cfd::core::BlockHash::BlockHash(&genesis_block_hash,(string *)&sig2);
  std::__cxx11::string::~string((string *)&sig2);
  cfd::core::SigHashType::SigHashType(&sighash_type,kSigHashDefault,false,false);
  cfd::core::TapScriptData::TapScriptData(&script_data);
  cfd::core::TaprootScriptTree::GetTapLeafHash((ByteData256 *)&sig2,&tree);
  cfd::core::ByteData256::operator=(&script_data.tap_leaf_hash,(ByteData256 *)&sig2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig2);
  script_data.code_separator_position = 0xffffffff;
  cfd::core::SigHashType::SigHashType(&local_97c,&sighash_type);
  cfd::core::ByteData::ByteData(&sig2.data_);
  utxo_list_00 = &utxo_list;
  cfd::core::ConfidentialTransaction::GetElementsSchnorrSignatureHash
            (&sighash2,&tx1,0,&local_97c,&genesis_block_hash,utxo_list_00,&script_data,&sig2.data_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig2);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&sig2,&sighash2);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&schnorr_sig,
             "\"b69db4132ff6a8e675a8fac89c94652e6331f09115ef3dfcb269842d0adba2cb\"",
             "sighash2.GetHex()",
             (char (*) [65])"b69db4132ff6a8e675a8fac89c94652e6331f09115ef3dfcb269842d0adba2cb",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig2);
  std::__cxx11::string::~string((string *)&sig2);
  if ((char)schnorr_sig.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&sig2);
    if (schnorr_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)schnorr_sig.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x113,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14,(Message *)&sig2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&schnorr_sig.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  cfd::core::SchnorrUtil::Sign(&sig2,&sighash2,&key);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_((string *)&schnorr_sig,&sig2,false);
  testing::internal::CmpHelperEQ<char[129],std::__cxx11::string>
            ((internal *)&gtest_ar_14,
             "\"4cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8\""
             ,"sig2.GetHex()",
             (char (*) [129])
             "4cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&schnorr_sig);
  std::__cxx11::string::~string((string *)&schnorr_sig);
  if (gtest_ar_14.success_ == false) {
    testing::Message::Message((Message *)&schnorr_sig);
    if (gtest_ar_14.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_14.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x115,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15,(Message *)&schnorr_sig)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&schnorr_sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_14.message_);
  cfd::core::SchnorrSignature::SchnorrSignature(&schnorr_sig,&sig2);
  cfd::core::SchnorrSignature::SetSigHashType(&schnorr_sig,&sighash_type);
  cfd::core::SchnorrSignature::GetData((ByteData *)&gtest_ar_14,&schnorr_sig,true);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack
            (&local_30,&tx1,0,(ByteData *)&gtest_ar_14);
  cfd::core::ScriptWitness::~ScriptWitness(&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_14);
  cfd::core::Script::GetData((ByteData *)&gtest_ar_14,&redeem_script);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack
            (&local_50,&tx1,0,(ByteData *)&gtest_ar_14);
  cfd::core::ScriptWitness::~ScriptWitness(&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_14);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack(&local_70,&tx1,0,&taproot_control);
  cfd::core::ScriptWitness::~ScriptWitness(&local_70);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&gtest_ar_14,&tx1.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<char[829],std::__cxx11::string>
            ((internal *)&gtest_ar_15,
             "\"020000000102f746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290100000000fffffffff746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000017d77c300016001423dc2db292ef54e171839e4a4391d8b45aefcd4b0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007d000000000000000000440396f2b94c6a81151d07faa26d5f5d7c751b62b1aea59ad7ed9d17fea60ef17e8e2eab28b55796ec0d01b0565c4658b279381674dcce633ee1851125ac762c494404cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8222091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac21c491d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e000000000000000000\""
             ,"tx1.GetHex()",
             (char (*) [829])
             "020000000102f746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290100000000fffffffff746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000017d77c300016001423dc2db292ef54e171839e4a4391d8b45aefcd4b0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007d000000000000000000440396f2b94c6a81151d07faa26d5f5d7c751b62b1aea59ad7ed9d17fea60ef17e8e2eab28b55796ec0d01b0565c4658b279381674dcce633ee1851125ac762c494404cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8222091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac21c491d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e000000000000000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_14);
  std::__cxx11::string::~string((string *)&gtest_ar_14);
  if (gtest_ar_15.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (gtest_ar_15.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_15.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c38,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_c38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_15.message_);
  gtest_ar_15.success_ = cfd::core::SchnorrPubkey::Verify(&schnorr_pubkey,&schnorr_sig,&sighash2);
  gtest_ar_15.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar_15.success_) {
    testing::Message::Message((Message *)&local_c38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_14,(internal *)&gtest_ar_15,
               (AssertionResult *)"schnorr_pubkey.Verify(schnorr_sig, sighash2)","false","true",
               (char *)utxo_list_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_ba8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x11d,(char *)CONCAT71(gtest_ar_14._1_7_,gtest_ar_14.success_));
    testing::internal::AssertHelper::operator=(&local_ba8,(Message *)&local_c38);
    testing::internal::AssertHelper::~AssertHelper(&local_ba8);
    std::__cxx11::string::~string((string *)&gtest_ar_14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_15.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script_data);
  cfd::core::BlockHash::~BlockHash(&genesis_block_hash);
  std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::~vector
            (&utxo_list);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx1);
  cfd::core::Address::~Address(&addr);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&ref);
  cfd::core::DescriptorNode::~DescriptorNode(&desc.root_node_);
  cfd::core::Address::~Address(&addr01);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&taproot_control);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk0);
  cfd::core::Script::~Script(&locking_script);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
  cfd::core::Script::~Script(&redeem_script);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return;
}

Assistant:

TEST(TaprootUtil, CreateTapScriptControl_Elements_Sign) {
  Privkey key = Privkey::FromWif(
    "cQRxS6BoPsuT8nyHMCYAKsRVDSnLisMxw4gUTeMURKioMMxTMSPE");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script redeem_script = (ScriptBuilder() << schnorr_pubkey.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  std::vector<ByteData256> nodes;
  NetType net_type = NetType::kElementsRegtest;
  TaprootScriptTree tree(redeem_script, net_type);
  EXPECT_EQ("tl(2091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac)", tree.ToString());
  EXPECT_EQ("28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0", tree.GetTapLeafHash().GetHex());
  EXPECT_EQ("28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0", tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ("bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495", tree.GetTweakedPubkey(schnorr_pubkey).GetHex());
  Script locking_script;
  SchnorrPubkey pk0;
  auto taproot_control = TaprootUtil::CreateTapScriptControl(
      schnorr_pubkey, tree, &pk0, &locking_script);
  EXPECT_EQ("bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495", pk0.GetHex());
  Address addr01(net_type, WitnessVersion::kVersion1, pk0, GetElementsAddressFormatList());
  EXPECT_EQ("ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz", addr01.GetAddress());
  EXPECT_EQ(locking_script.GetHex(), addr01.GetLockingScript().GetHex());
  EXPECT_EQ("5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495", addr01.GetLockingScript().GetHex());
  EXPECT_TRUE(tree.HasTapLeaf());
  EXPECT_TRUE(tree.IsElements());

  auto desc = Descriptor::ParseElements("tr(91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e,pk(91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e))");
  auto ref = desc.GetReference();
  auto addr = ref.GenerateAddress(NetType::kElementsRegtest);
  EXPECT_EQ("ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz", addr.GetAddress());
  EXPECT_EQ("5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495", ref.GetLockingScript().GetHex());
  EXPECT_EQ("91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e", ref.GetKeyList()[0].GetSchnorrPubkey().GetHex());
  EXPECT_EQ(tree.ToString(), ref.GetScriptTree().ToString());
  EXPECT_TRUE(ref.GetScriptTree().IsElements());

  ConfidentialTransaction tx1("020000000102f746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290100000000fffffffff746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000017d77c300016001423dc2db292ef54e171839e4a4391d8b45aefcd4b0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007d000000000000000000140396f2b94c6a81151d07faa26d5f5d7c751b62b1aea59ad7ed9d17fea60ef17e8e2eab28b55796ec0d01b0565c4658b279381674dcce633ee1851125ac762c494000000000000000000");
  ConfidentialAssetId asset("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  std::vector<ConfidentialTxOut> utxo_list(2);
  utxo_list[0] = ConfidentialTxOut(
    Script("512016f8551db6483d403e9bf3c0b74a5bbafaa20cf0e45ca7e4a35cae924f7a0514"),
    asset, ConfidentialValue(Amount(200000000)));
  utxo_list[1] = ConfidentialTxOut(
    Script("5120e247cebb9d05e3ce87133b3c6cfd15eed31b43f61fe3ceede12594e55966035b"),
    asset, ConfidentialValue(Amount(200000000)));
  BlockHash genesis_block_hash("cc2641af46f536fba45aab6016f63e12a80e4c98bbb2686dafb22b9451cfe338");
  SigHashType sighash_type = SigHashType(SigHashAlgorithm::kSigHashDefault);
  TapScriptData script_data;
  script_data.tap_leaf_hash = tree.GetTapLeafHash();
  script_data.code_separator_position = cfd::core::kDefaultCodeSeparatorPosition;
  auto sighash2 = tx1.GetElementsSchnorrSignatureHash(
    0, sighash_type, genesis_block_hash, utxo_list, &script_data);
  EXPECT_EQ("b69db4132ff6a8e675a8fac89c94652e6331f09115ef3dfcb269842d0adba2cb", sighash2.GetHex());
  auto sig2 = SchnorrUtil::Sign(sighash2, key);
  EXPECT_EQ("4cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8", sig2.GetHex());
  SchnorrSignature schnorr_sig(sig2);
  schnorr_sig.SetSigHashType(sighash_type);
  tx1.AddScriptWitnessStack(0, schnorr_sig.GetData(true));
  tx1.AddScriptWitnessStack(0, redeem_script.GetData());
  tx1.AddScriptWitnessStack(0, taproot_control);
  EXPECT_EQ("020000000102f746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290100000000fffffffff746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000017d77c300016001423dc2db292ef54e171839e4a4391d8b45aefcd4b0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007d000000000000000000440396f2b94c6a81151d07faa26d5f5d7c751b62b1aea59ad7ed9d17fea60ef17e8e2eab28b55796ec0d01b0565c4658b279381674dcce633ee1851125ac762c494404cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8222091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac21c491d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e000000000000000000", tx1.GetHex());

  EXPECT_TRUE(schnorr_pubkey.Verify(schnorr_sig, sighash2));
}